

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O0

XMLCh __thiscall xercesc_4_0::ReaderMgr::skipUntilInOrWS(ReaderMgr *this,XMLCh *listToSkip)

{
  bool bVar1;
  XMLCh toCheck;
  int iVar2;
  XMLCh nextCh;
  XMLCh *listToSkip_local;
  ReaderMgr *this_local;
  
  while (((toCheck = peekNextChar(this), toCheck != L'\0' &&
          (bVar1 = XMLReader::isWhitespace(this->fCurReader,toCheck), !bVar1)) &&
         (iVar2 = XMLString::indexOf(listToSkip,toCheck), iVar2 == -1))) {
    getNextChar(this);
  }
  return toCheck;
}

Assistant:

XMLCh ReaderMgr::skipUntilInOrWS(const XMLCh* const listToSkip)
{
    XMLCh nextCh;
    // If we get an end of file char, then return
    while ((nextCh = peekNextChar())!=0)
    {
        if (fCurReader->isWhitespace(nextCh))
            break;

        if (XMLString::indexOf(listToSkip, nextCh) != -1)
            break;

        // Its one of ours, so eat it
        getNextChar();
    }
    return nextCh;
}